

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void check_type_68k(int type,LispPTR *ptr)

{
  uint uVar1;
  LispPTR LVar2;
  DLword *pDVar3;
  ulong uVar4;
  
  pDVar3 = MDStypetbl;
  if (((ulong)ptr & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",ptr);
  }
  uVar4 = (long)ptr - (long)Lisp_world;
  uVar1 = (uint)(uVar4 >> 10) & 0x7fffff;
  if ((*(ushort *)((ulong)(pDVar3 + uVar1) ^ 2) & 0x7ff) != type) {
    LVar2 = LAddrFromNative(ptr);
    printf("Mismatching occur !!! LispAddr 0x%x  type %d\n",(ulong)LVar2,type);
    exit(-1);
  }
  pDVar3 = MDStypetbl;
  if (((ulong)ptr & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",ptr);
    pDVar3 = MDStypetbl;
    uVar4 = (long)ptr - (long)Lisp_world;
    printf("Misaligned pointer in LAddrFromNative %p\n",ptr);
    uVar1 = (uint)((ulong)((long)ptr - (long)Lisp_world) >> 10) & 0x7fffff;
  }
  printf("LispPTR 0x%x is the datatype %d\n",uVar4 >> 1 & 0xffffffff,
         (ulong)(*(ushort *)((ulong)(pDVar3 + uVar1) ^ 2) & 0x7ff));
  return;
}

Assistant:

void check_type_68k(int type, LispPTR *ptr) {
  if (type != (GetTypeNumber(LAddrFromNative(ptr)))) {
    printf("Mismatching occur !!! LispAddr 0x%x  type %d\n", LAddrFromNative(ptr), type);
    exit(-1);
  }

  printf("LispPTR 0x%x is the datatype %d\n", LAddrFromNative(ptr),
         GetTypeNumber(LAddrFromNative(ptr)));
}